

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void obj_move_timers(obj *src,obj *dest)

{
  timer_element *ptVar1;
  int iVar2;
  
  ptVar1 = (timer_element *)&src->olev->lev_timers;
  iVar2 = 0;
  while( true ) {
    ptVar1 = ptVar1->next;
    if (ptVar1 == (timer_element *)0x0) break;
    if ((ptVar1->kind == 2) && ((obj *)ptVar1->arg == src)) {
      ptVar1->arg = dest;
      dest->timed = dest->timed + '\x01';
      iVar2 = iVar2 + 1;
    }
  }
  if (iVar2 != src->timed) {
    panic("obj_move_timers");
  }
  src->timed = '\0';
  return;
}

Assistant:

void obj_move_timers(struct obj *src, struct obj *dest)
{
    int count;
    timer_element *curr;

    for (count = 0, curr = src->olev->lev_timers; curr; curr = curr->next)
	if (curr->kind == TIMER_OBJECT && curr->arg == src) {
	    curr->arg = dest;
	    dest->timed++;
	    count++;
	}
    if (count != src->timed)
	panic("obj_move_timers");
    src->timed = 0;
}